

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool __thiscall IR::Instr::HasEmptyArgOutChain(Instr *this,Instr **startCallInstrOut)

{
  Opnd *this_00;
  _func_int **pp_Var1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  OpndKind OVar6;
  uint uVar7;
  undefined4 *puVar8;
  uint uVar9;
  
  bVar4 = CanHaveArgOutChain(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xd44,"(CanHaveArgOutChain())","CanHaveArgOutChain()");
    if (!bVar4) goto LAB_004b9ed4;
    *puVar8 = 0;
  }
  OVar5 = Opnd::GetKind(this->m_src2);
  if (OVar5 == OpndKindReg) {
    this_00 = this->m_src2;
    OVar6 = Opnd::GetKind(this_00);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_004b9ed4;
      *puVar8 = 0;
    }
    pp_Var1 = this_00[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_004b9ed4;
      *puVar8 = 0;
    }
    uVar7 = *(uint *)(pp_Var1 + 3);
    uVar9 = uVar7 & 0x100000;
    if ((uVar9 != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
      if (!bVar4) goto LAB_004b9ed4;
      *puVar8 = 0;
      uVar7 = *(uint *)(pp_Var1 + 3);
      uVar9 = uVar7 & 0x100000;
    }
    if ((uVar7 & 1) == 0 || uVar9 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xd4a,"(!argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                         "Arg tree not single def...");
      if (!bVar4) goto LAB_004b9ed4;
      *puVar8 = 0;
    }
    pIVar2 = (Instr *)pp_Var1[5];
    if (pIVar2->m_opcode != StartCall) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xd4c,"(startCallInstr->m_opcode == Js::OpCode::StartCall)",
                         "Problem with arg chain.");
      if (!bVar4) {
LAB_004b9ed4:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    if (startCallInstrOut != (Instr **)0x0) {
      *startCallInstrOut = pIVar2;
    }
  }
  return OVar5 == OpndKindReg;
}

Assistant:

bool Instr::HasEmptyArgOutChain(IR::Instr** startCallInstrOut)
{
    Assert(CanHaveArgOutChain());

    if (GetSrc2()->IsRegOpnd())
    {
        IR::RegOpnd * argLinkOpnd = GetSrc2()->AsRegOpnd();
        StackSym *argLinkSym = argLinkOpnd->m_sym->AsStackSym();
        AssertMsg(!argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
        IR::Instr* startCallInstr = argLinkSym->m_instrDef;
        AssertMsg(startCallInstr->m_opcode == Js::OpCode::StartCall, "Problem with arg chain.");
        if (startCallInstrOut != nullptr)
        {
            *startCallInstrOut = startCallInstr;
        }
        return true;
    }

    return false;
}